

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct16_stage7_avx2(__m256i *output,__m256i *x1)

{
  undefined1 in_stack_00000020 [32];
  undefined1 in_stack_00000040 [32];
  __m256i *in_stack_00000070;
  __m256i *in_stack_00000078;
  
  btf_16_adds_subs_out_avx2
            (in_stack_00000078,in_stack_00000070,(__m256i)in_stack_00000040,
             (__m256i)in_stack_00000020);
  btf_16_adds_subs_out_avx2
            (in_stack_00000078,in_stack_00000070,(__m256i)in_stack_00000040,
             (__m256i)in_stack_00000020);
  btf_16_adds_subs_out_avx2
            (in_stack_00000078,in_stack_00000070,(__m256i)in_stack_00000040,
             (__m256i)in_stack_00000020);
  btf_16_adds_subs_out_avx2
            (in_stack_00000078,in_stack_00000070,(__m256i)in_stack_00000040,
             (__m256i)in_stack_00000020);
  btf_16_adds_subs_out_avx2
            (in_stack_00000078,in_stack_00000070,(__m256i)in_stack_00000040,
             (__m256i)in_stack_00000020);
  btf_16_adds_subs_out_avx2
            (in_stack_00000078,in_stack_00000070,(__m256i)in_stack_00000040,
             (__m256i)in_stack_00000020);
  btf_16_adds_subs_out_avx2
            (in_stack_00000078,in_stack_00000070,(__m256i)in_stack_00000040,
             (__m256i)in_stack_00000020);
  btf_16_adds_subs_out_avx2
            (in_stack_00000078,in_stack_00000070,(__m256i)in_stack_00000040,
             (__m256i)in_stack_00000020);
  return;
}

Assistant:

static inline void idct16_stage7_avx2(__m256i *output, __m256i *x1) {
  btf_16_adds_subs_out_avx2(&output[0], &output[15], x1[0], x1[15]);
  btf_16_adds_subs_out_avx2(&output[1], &output[14], x1[1], x1[14]);
  btf_16_adds_subs_out_avx2(&output[2], &output[13], x1[2], x1[13]);
  btf_16_adds_subs_out_avx2(&output[3], &output[12], x1[3], x1[12]);
  btf_16_adds_subs_out_avx2(&output[4], &output[11], x1[4], x1[11]);
  btf_16_adds_subs_out_avx2(&output[5], &output[10], x1[5], x1[10]);
  btf_16_adds_subs_out_avx2(&output[6], &output[9], x1[6], x1[9]);
  btf_16_adds_subs_out_avx2(&output[7], &output[8], x1[7], x1[8]);
}